

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
          (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *this,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *other)

{
  byte *start;
  bool bVar1;
  int iVar2;
  ValueLength __n;
  ulong uVar3;
  
  start = *(byte **)this;
  if (start == *(byte **)other) {
    bVar1 = true;
  }
  else {
    if (*start == **(byte **)other) {
      __n = (ValueLength)"\x01\x01"[*start];
      if (__n == 0) {
        __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                         ,start);
      }
      uVar3 = (ulong)"\x01\x01"[**(byte **)other];
      if (uVar3 == 0) {
        uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          (other,*(byte **)other);
      }
      if (__n == uVar3) {
        iVar2 = bcmp(*(void **)this,*(void **)other,__n);
        return iVar2 == 0;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool binaryEquals(SliceBase<S, T> const& other) const {
    if (start() == other.start()) {
      // same underlying data, so the slices must be identical
      return true;
    }

    if (head() != other.head()) {
      return false;
    }

    ValueLength const size = byteSize();

    if (size != other.byteSize()) {
      return false;
    }

    return (std::memcmp(start(), other.start(), checkOverflow(size)) == 0);
  }